

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O1

imagef * __thiscall basisu::imagef::set(imagef *this,image *src,vec4F *scale,vec4F *bias)

{
  uint32_t w;
  uint32_t h;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vec4F local_48;
  
  w = src->m_width;
  h = src->m_height;
  local_48.m_v[0] = 0.0;
  local_48.m_v[1] = 0.0;
  local_48.m_v[2] = 0.0;
  local_48.m_v[3] = 1.0;
  crop(this,w,h,0xffffffff,&local_48);
  if (0 < (int)h) {
    uVar1 = 0;
    auVar6 = extraout_XMM0;
    do {
      if (w != 0) {
        uVar2 = 0;
        do {
          if ((src->m_width <= uVar2) || (src->m_height <= uVar1)) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xb00,
                          "const color_rgba &basisu::image::operator()(uint32_t, uint32_t) const");
          }
          uVar3 = src->m_pitch * uVar1 + uVar2;
          if ((src->m_pixels).m_size <= uVar3) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::color_rgba>::operator[](size_t) const [T = basisu::color_rgba]"
                         );
          }
          if ((this->m_width <= uVar2) || (this->m_height <= uVar1)) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3e,"vec4F &basisu::imagef::operator()(uint32_t, uint32_t)");
          }
          uVar4 = this->m_pitch * uVar1 + uVar2;
          if ((this->m_pixels).m_size <= uVar4) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) [T = basisu::vec<4, float>]"
                         );
          }
          auVar5 = pmovzxbd(auVar6,(src->m_pixels).m_p[uVar3].field_0);
          auVar6._0_4_ = bias->m_v[0] + scale->m_v[0] * (float)auVar5._0_4_;
          auVar6._4_4_ = bias->m_v[1] + scale->m_v[1] * (float)auVar5._4_4_;
          auVar6._8_4_ = bias->m_v[2] + scale->m_v[2] * (float)auVar5._8_4_;
          auVar6._12_4_ = bias->m_v[3] + scale->m_v[3] * (float)auVar5._12_4_;
          *(undefined1 (*) [16])(this->m_pixels).m_p[uVar4].m_v = auVar6;
          uVar2 = uVar2 + 1;
        } while (w != uVar2);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != h);
  }
  return this;
}

Assistant:

imagef &set(const image &src, const vec4F &scale = vec4F(1), const vec4F &bias = vec4F(0))
		{
			const uint32_t width = src.get_width();
			const uint32_t height = src.get_height();

			resize(width, height);

			for (int y = 0; y < (int)height; y++)
			{
				for (uint32_t x = 0; x < width; x++)
				{
					const color_rgba &src_pixel = src(x, y);
					(*this)(x, y).set((float)src_pixel.r * scale[0] + bias[0], (float)src_pixel.g * scale[1] + bias[1], (float)src_pixel.b * scale[2] + bias[2], (float)src_pixel.a * scale[3] + bias[3]);
				}
			}

			return *this;
		}